

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2_pack8.h
# Opt level: O0

void ncnn::pooling2x2s2_max_pack8_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  long lVar5;
  int iVar6;
  long *in_RSI;
  long *in_RDI;
  __m256 _max;
  __m256 _max1;
  __m256 _max0;
  __m256 _r11;
  __m256 _r10;
  __m256 _r01;
  __m256 _r00;
  int j;
  int i;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  Mat *m_1;
  int local_3f0;
  int local_3ec;
  undefined1 (*local_3e8) [32];
  undefined1 (*local_3e0) [32];
  undefined1 (*local_380) [32];
  int local_330;
  
  lVar4 = in_RDI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  iVar6 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 8;
  for (local_330 = 0; local_330 < (int)lVar4; local_330 = local_330 + 1) {
    local_3e0 = (undefined1 (*) [32])(*in_RDI + in_RDI[8] * (long)local_330 * in_RDI[2]);
    local_380 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_330 * in_RSI[2]);
    local_3e8 = (undefined1 (*) [32])(*local_3e0 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    for (local_3ec = 0; local_3ec < (int)lVar5; local_3ec = local_3ec + 1) {
      for (local_3f0 = 0; local_3f0 < iVar1; local_3f0 = local_3f0 + 1) {
        auVar2 = vmaxps_avx(*local_3e0,local_3e0[1]);
        auVar3 = vmaxps_avx(*local_3e8,local_3e8[1]);
        auVar2 = vmaxps_avx(auVar2,auVar3);
        *local_380 = auVar2;
        local_3e0 = local_3e0 + 2;
        local_3e8 = local_3e8 + 2;
        local_380 = local_380 + 1;
      }
      local_3e0 = (undefined1 (*) [32])(*local_3e0 + (long)iVar6 * 4);
      local_3e8 = (undefined1 (*) [32])(*local_3e8 + (long)iVar6 * 4);
    }
  }
  return;
}

Assistant:

static void pooling2x2s2_max_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);

                __m256 _max0 = _mm256_max_ps(_r00, _r01);
                __m256 _max1 = _mm256_max_ps(_r10, _r11);
                __m256 _max = _mm256_max_ps(_max0, _max1);

                _mm256_storeu_ps(outptr, _max);

                r0 += 16;
                r1 += 16;
                outptr += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
        }
    }
}